

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_ushl_b_arm(void *vd,void *vn,void *vm,uint32_t desc)

{
  byte bVar1;
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  undefined1 local_53;
  uint8_t res;
  uint8_t nn;
  int8_t mm;
  uint8_t *m;
  uint8_t *n;
  uint8_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < (long)opr_sz_00; opr_sz = opr_sz + 1) {
    bVar1 = *(byte *)((long)vm + opr_sz);
    local_53 = '\0';
    if ((char)bVar1 < '\0') {
      if (-8 < (char)bVar1) {
        local_53 = (char)((int)(uint)*(byte *)((long)vn + opr_sz) >> (-bVar1 & 0x1f));
      }
    }
    else if ((char)bVar1 < '\b') {
      local_53 = *(byte *)((long)vn + opr_sz) << (bVar1 & 0x1f);
    }
    *(char *)((long)vd + opr_sz) = local_53;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_ushl_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint8_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz; ++i) {
        int8_t mm = m[i];
        uint8_t nn = n[i];
        uint8_t res = 0;
        if (mm >= 0) {
            if (mm < 8) {
                res = nn << mm;
            }
        } else {
            if (mm > -8) {
                res = nn >> -mm;
            }
        }
        d[i] = res;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}